

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

void __thiscall
CommandLineArguments::setPackageName(CommandLineArguments *this,int ac,char **av,int *i)

{
  SimpleString *this_00;
  SimpleString packageName;
  SimpleString *in_stack_ffffffffffffff78;
  SimpleString *in_stack_ffffffffffffff80;
  SimpleString *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  char **in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  CommandLineArguments *in_stack_ffffffffffffffd8;
  
  SimpleString::SimpleString(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  getParameterField(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                    in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  SimpleString::~SimpleString((SimpleString *)0x18d6ea);
  this_00 = (SimpleString *)SimpleString::size((SimpleString *)0x18d6f4);
  if (this_00 != (SimpleString *)0x0) {
    SimpleString::operator=(this_00,in_stack_ffffffffffffff78);
  }
  SimpleString::~SimpleString((SimpleString *)0x18d76b);
  return;
}

Assistant:

void CommandLineArguments::setPackageName(int ac, const char *const *av, int& i)
{
    SimpleString packageName = getParameterField(ac, av, i, "-k");
    if (packageName.size() == 0) return;

    packageName_ = packageName;
}